

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

CTcSymProp * __thiscall CTcParser::look_up_prop(CTcParser *this,CTcToken *tok,int show_err)

{
  byte *pbVar1;
  char *str;
  size_t len;
  short sVar2;
  CVmHashEntry *this_00;
  textchar_t *sym;
  
  sym = tok->text_;
  this_00 = (CVmHashEntry *)
            CTcPrsSymtab::find(this->global_symtab_,sym,tok->text_len_,(CTcPrsSymtab **)0x0);
  if (this_00 == (CVmHashEntry *)0x0) {
    this_00 = (CVmHashEntry *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x30,(size_t)sym);
    str = tok->text_;
    len = tok->text_len_;
    sVar2 = (short)*(undefined4 *)&G_cg->next_prop_;
    G_cg->next_prop_ = sVar2 + 1;
    CVmHashEntry::CVmHashEntry(this_00,str,len,0);
    *(undefined4 *)&this_00->field_0x24 = 3;
    *(short *)&this_00[1]._vptr_CVmHashEntry = sVar2;
    pbVar1 = (byte *)((long)&this_00[1]._vptr_CVmHashEntry + 2);
    *pbVar1 = *pbVar1 & 0xf8;
    this_00->_vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_003209a0;
    (*this->global_symtab_->_vptr_CTcPrsSymtab[3])(this->global_symtab_,this_00);
    (*this_00->_vptr_CVmHashEntry[0xf])(this_00);
  }
  else if (*(int *)&this_00->field_0x24 != 3) {
    if (show_err == 0) {
      this_00 = (CVmHashEntry *)0x0;
    }
    else {
      this_00 = (CVmHashEntry *)0x0;
      CTcTokenizer::log_error(0x2b63,(ulong)(uint)tok->text_len_,tok->text_);
    }
  }
  return (CTcSymProp *)this_00;
}

Assistant:

CTcSymProp *CTcParser::look_up_prop(const CTcToken *tok, int show_err)
{
    /* look up the symbol */
    CTcSymProp *prop = (CTcSymProp *)global_symtab_->find(
        tok->get_text(), tok->get_text_len());

    /* if it's already defined, make sure it's a property */
    if (prop != 0)
    {
        /* make sure it's a property */
        if (prop->get_type() != TC_SYM_PROP)
        {
            /* log an error if appropriate */
            if (show_err)
                G_tok->log_error(TCERR_REDEF_AS_PROP,
                                 (int)tok->get_text_len(), tok->get_text());

            /* we can't use the symbol, so forget it */
            prop = 0;
        }
    }
    else
    {
        /* create the new property symbol */
        prop = new CTcSymProp(tok->get_text(), tok->get_text_len(),
                              FALSE, G_cg->new_prop_id());

        /* add it to the global symbol table */
        global_symtab_->add_entry(prop);

        /* mark it as referenced */
        prop->mark_referenced();
    }

    /* return the property symbol */
    return prop;
}